

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O1

void __thiscall
QCommandLineOptionPrivate::QCommandLineOptionPrivate
          (QCommandLineOptionPrivate *this,QStringList *names)

{
  long lVar1;
  Data *pDVar2;
  QString *pQVar3;
  QStringList nameList;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  pDVar2 = (names->d).d;
  pQVar3 = (names->d).ptr;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  nameList.d.ptr = (QString *)pDVar2;
  nameList.d.d = (Data *)in_stack_ffffffffffffffc8;
  nameList.d.size = (qsizetype)pQVar3;
  removeInvalidNames(&this->names,nameList);
  QArrayDataPointer<QString>::~QArrayDataPointer
            ((QArrayDataPointer<QString> *)&stack0xffffffffffffffd0);
  *(undefined8 *)((long)&(this->defaultValues).d.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->defaultValues).d.size + 4) = 0;
  (this->defaultValues).d.d = (Data *)0x0;
  (this->defaultValues).d.ptr = (QString *)0x0;
  (this->description).d.ptr = (char16_t *)0x0;
  (this->description).d.size = 0;
  (this->valueName).d.size = 0;
  (this->description).d.d = (Data *)0x0;
  (this->valueName).d.d = (Data *)0x0;
  (this->valueName).d.ptr = (char16_t *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE
    explicit QCommandLineOptionPrivate(const QStringList &names)
        : names(removeInvalidNames(names))
    { }